

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_transaction.cpp
# Opt level: O2

vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *
cfd::api::json::TransactionJsonApi::ConvertFromLockingScript
          (vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *__return_storage_ptr__,
          AddressFactory *factory,Script *script,string *script_type,int64_t *require_num)

{
  LockingScriptType script_type_00;
  pointer __x;
  ByteData160 hash;
  ExtractScriptData extract_data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3a0;
  Address local_388;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_210 [24];
  Pubkey pubkey_1;
  Script local_1e0;
  Address address;
  
  core::Script::Script(&local_1e0,script);
  ExtractLockingScript(&extract_data,&local_1e0);
  core::Script::~Script(&local_1e0);
  if (script_type != (string *)0x0) {
    std::__cxx11::string::string((string *)&address,"nonstandard",(allocator *)&local_388);
    if (extract_data.script_type != kFee) {
      ConvertLockingScriptTypeString_abi_cxx11_
                ((string *)&local_388,(TransactionJsonApi *)(ulong)extract_data.script_type,
                 script_type_00);
      std::__cxx11::string::operator=((string *)&address,(string *)&local_388);
      std::__cxx11::string::~string((string *)&local_388);
    }
    std::__cxx11::string::_M_assign((string *)script_type);
    std::__cxx11::string::~string((string *)&address);
  }
  if (require_num != (int64_t *)0x0) {
    *require_num = ((long)extract_data.pushed_datas.
                          super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)extract_data.pushed_datas.
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  }
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  core::Address::Address(&address);
  switch(extract_data.script_type) {
  case kPayToPubkey:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3a0,
               &(extract_data.pushed_datas.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_start)->data_);
    core::Pubkey::Pubkey((Pubkey *)&hash,(ByteData *)&local_3a0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3a0);
    AddressFactory::CreateP2pkhAddress(&local_388,factory,(Pubkey *)&hash);
    core::Address::operator=(&address,&local_388);
    core::Address::~Address(&local_388);
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              (__return_storage_ptr__,&address);
    goto LAB_003c7854;
  case kPayToPubkeyHash:
    core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388,
               extract_data.pushed_datas.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start);
    core::ByteData160::ByteData160
              (&hash,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388);
    AddressFactory::GetAddressByHash(&local_388,factory,kP2pkhAddress,&hash);
    core::Address::operator=(&address,&local_388);
    core::Address::~Address(&local_388);
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              (__return_storage_ptr__,&address);
    goto LAB_003c7854;
  case kPayToScriptHash:
    core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388,
               extract_data.pushed_datas.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start);
    core::ByteData160::ByteData160
              (&hash,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388);
    AddressFactory::GetAddressByHash(&local_388,factory,kP2shAddress,&hash);
    core::Address::operator=(&address,&local_388);
    core::Address::~Address(&local_388);
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              (__return_storage_ptr__,&address);
LAB_003c7854:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
    break;
  case kMultisig:
    if (require_num != (int64_t *)0x0) {
      *require_num = extract_data.req_sigs;
    }
    for (__x = extract_data.pushed_datas.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start;
        __x != extract_data.pushed_datas.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_finish; __x = __x + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash,&__x->data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (local_210,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
      core::Pubkey::Pubkey(&pubkey_1,(ByteData *)local_210);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_210);
      AddressFactory::CreateP2pkhAddress(&local_388,factory,&pubkey_1);
      core::Address::operator=(&address,&local_388);
      core::Address::~Address(&local_388);
      std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
                (__return_storage_ptr__,&address);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
    }
    break;
  case kWitnessV0ScriptHash:
  case kWitnessV0KeyHash:
  case kWitnessV1Taproot:
    AddressFactory::GetSegwitAddressByHash
              (&local_388,factory,
               extract_data.pushed_datas.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start,extract_data.witness_version);
    core::Address::operator=(&address,&local_388);
    core::Address::~Address(&local_388);
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              (__return_storage_ptr__,&address);
    break;
  case kWitnessUnknown:
    AddressFactory::GetSegwitAddressByHash
              (&local_388,factory,
               extract_data.pushed_datas.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start,extract_data.witness_version);
    core::Address::operator=(&address,&local_388);
    core::Address::~Address(&local_388);
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              (__return_storage_ptr__,&address);
  }
  core::Address::~Address(&address);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&extract_data.pushed_datas);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Address> TransactionJsonApi::ConvertFromLockingScript(
    const AddressFactory& factory, const Script& script,
    std::string* script_type, int64_t* require_num) {
  ExtractScriptData extract_data =
      TransactionJsonApi::ExtractLockingScript(script);
  LockingScriptType type = extract_data.script_type;
  if (script_type != nullptr) {
    std::string type_str = "nonstandard";
    if (type != LockingScriptType::kFee) {
      type_str = TransactionJsonApi::ConvertLockingScriptTypeString(type);
    }
    *script_type = type_str;
  }
  if (require_num != nullptr) {
    *require_num = static_cast<int64_t>(extract_data.pushed_datas.size());
  }

  std::vector<Address> addr_list;
  Address address;
  if (type == LockingScriptType::kMultisig) {
    if (require_num != nullptr) {
      *require_num = extract_data.req_sigs;
    }
    for (ByteData pubkey_bytes : extract_data.pushed_datas) {
      Pubkey pubkey = Pubkey(pubkey_bytes);
      address = factory.CreateP2pkhAddress(pubkey);
      addr_list.push_back(address);
    }
  } else if (type == LockingScriptType::kPayToPubkey) {
    Pubkey pubkey = Pubkey(extract_data.pushed_datas[0]);
    address = factory.CreateP2pkhAddress(pubkey);
    addr_list.push_back(address);
  } else if (type == LockingScriptType::kPayToPubkeyHash) {
    ByteData160 hash =
        ByteData160(extract_data.pushed_datas[0].GetBytes());
    address = factory.GetAddressByHash(
        AddressType::kP2pkhAddress, hash);
    addr_list.push_back(address);
  } else if (type == LockingScriptType::kPayToScriptHash) {
    ByteData160 hash =
        ByteData160(extract_data.pushed_datas[0].GetBytes());
    address = factory.GetAddressByHash(
        AddressType::kP2shAddress, hash);
    addr_list.push_back(address);
  } else if ((type == LockingScriptType::kWitnessV0KeyHash) ||
      (type == LockingScriptType::kWitnessV0ScriptHash) ||
      (type == LockingScriptType::kWitnessV1Taproot)) {
    address = factory.GetSegwitAddressByHash(
          extract_data.pushed_datas[0], extract_data.witness_version);
    addr_list.push_back(address);
  } else if (type == LockingScriptType::kWitnessUnknown) {
    try {
      address = factory.GetSegwitAddressByHash(
            extract_data.pushed_datas[0], extract_data.witness_version);
      addr_list.push_back(address);
    } catch (const CfdException&) {
      // If the data is invalid, it will not be output.
    }
  } else {
    // do nothing
  }
  return addr_list;
}